

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  undefined8 *****pppppuVar1;
  undefined8 *****pppppuVar2;
  int iVar3;
  Runtime *this;
  Bracket *this_00;
  undefined4 extraout_var;
  unsigned_long pos;
  string str;
  list<Bracket_*,_std::allocator<Bracket_*>_> brackets;
  ifstream t;
  unsigned_long local_278;
  string local_270;
  undefined8 ****local_250;
  undefined8 ****local_248;
  undefined8 local_240;
  long local_238 [29];
  undefined8 auStack_150 [36];
  
  if (argc == 1) {
    Code::FinalShell();
  }
  else {
    this = (Runtime *)operator_new(8);
    Runtime::Runtime(this);
    std::ifstream::ifstream(local_238,argv[1],_S_in);
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&local_270,
               *(undefined8 *)((long)auStack_150 + *(long *)(local_238[0] + -0x18)),0xffffffff,0,
               0xffffffff);
    local_278 = 0;
    local_240 = 0;
    local_250 = &local_250;
    local_248 = &local_250;
    if (local_270._M_string_length != 0) {
      do {
        if (local_270._M_dataplus._M_p[local_278] == '(') {
          this_00 = (Bracket *)operator_new(0x40);
          Bracket::Bracket(this_00,&local_270,&local_278);
          iVar3 = (*(this_00->super_Atom)._vptr_Atom[3])(this_00,this);
          Data::check((Data *)CONCAT44(extraout_var,iVar3));
        }
        else {
          local_278 = local_278 + 1;
        }
      } while (local_278 < local_270._M_string_length);
    }
    Runtime::~Runtime(this);
    operator_delete(this);
    pppppuVar2 = (undefined8 *****)local_250;
    while (pppppuVar2 != &local_250) {
      pppppuVar1 = (undefined8 *****)*pppppuVar2;
      operator_delete(pppppuVar2);
      pppppuVar2 = pppppuVar1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    std::ifstream::~ifstream(local_238);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    if (argc == 1) {
        Code::FinalShell();
    } else {
        auto runtime = new Runtime();
        std::ifstream t(argv[1]);
        std::string str((std::istreambuf_iterator<char>(t)), std::istreambuf_iterator<char>());
        unsigned long pos = 0;
        std::list<Bracket *> brackets;
        Bracket* temp;
        while (pos < str.length()) {
            if (str[pos] != '(') {
                pos++;
            } else {
                temp = new Bracket(str, pos);
                Data::check(temp->eval(runtime));
            }
        }
        delete runtime;
    }

    return 0;
}